

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Entry * __thiscall
kj::
Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
::insert(Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
         *this,Entry *row)

{
  bool bVar1;
  uint skip;
  size_t pos;
  Entry *pEVar2;
  Maybe<unsigned_long> local_28;
  Entry *local_18;
  Entry *row_local;
  Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
  *this_local;
  
  local_18 = row;
  row_local = (Entry *)this;
  pos = Vector<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry>::size(&this->rows);
  pEVar2 = local_18;
  skip = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&kj::maxValue);
  Impl<0UL,_false>::insert((Impl<0UL,_false> *)&local_28,this,pos,pEVar2,skip);
  bVar1 = Maybe<unsigned_long>::operator==(&local_28);
  Maybe<unsigned_long>::~Maybe(&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pEVar2 = mv<kj::HashMap<unsigned_long,capnp::InterfaceSchema>::Entry>(local_18);
    pEVar2 = Vector<kj::HashMap<unsigned_long,capnp::InterfaceSchema>::Entry>::
             add<kj::HashMap<unsigned_long,capnp::InterfaceSchema>::Entry>
                       ((Vector<kj::HashMap<unsigned_long,capnp::InterfaceSchema>::Entry> *)this,
                        pEVar2);
    return pEVar2;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}